

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

IssuePtr __thiscall
libcellml::Validator::ValidatorImpl::makeIssueIllegalIdentifier(ValidatorImpl *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IssueImpl *this_00;
  ReferenceRule RVar2;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  IssuePtr IVar4;
  string local_40;
  
  Issue::IssueImpl::create();
  RVar2 = validateCellmlIdentifier(in_RDX);
  Issue::IssueImpl::setReferenceRule
            ((IssueImpl *)
             (this->super_LoggerImpl).mErrors.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[1],XML_ID_ATTRIBUTE);
  this_00 = (IssueImpl *)
            (this->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (RVar2 == DATA_REPR_IDENTIFIER_BEGIN_EURO_NUM) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "CellML identifiers must not begin with a European numeric character [0-9].","");
    Issue::IssueImpl::setDescription(this_00,&local_40);
    _Var3._M_pi = extraout_RDX_00;
  }
  else if (RVar2 == DATA_REPR_IDENTIFIER_AT_LEAST_ONE_ALPHANUM) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "CellML identifiers must contain one or more basic Latin alphabetic characters.","");
    Issue::IssueImpl::setDescription(this_00,&local_40);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "CellML identifiers must not contain any characters other than [a-zA-Z0-9_].","");
    Issue::IssueImpl::setDescription(this_00,&local_40);
    _Var3._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_02;
  }
  IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Validator::ValidatorImpl::makeIssueIllegalIdentifier(const std::string &name) const
{
    auto issue = Issue::IssueImpl::create();
    auto referenceRule = validateCellmlIdentifier(name);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);

    if (referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_AT_LEAST_ONE_ALPHANUM) {
        // One or more alphabetic characters.
        issue->mPimpl->setDescription("CellML identifiers must contain one or more basic Latin alphabetic characters.");
    } else if (referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_BEGIN_EURO_NUM) {
        // Does not start with numeric character.
        issue->mPimpl->setDescription("CellML identifiers must not begin with a European numeric character [0-9].");
    } else { /* referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_LATIN_ALPHANUM */
        // Basic Latin alphanumeric characters and underscores.
        issue->mPimpl->setDescription("CellML identifiers must not contain any characters other than [a-zA-Z0-9_].");
    }

    return issue;
}